

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::CWriter::
WriteVarsByType<std::vector<wabt::Type,std::allocator<wabt::Type>>,wabt::(anonymous_namespace)::CWriter::WriteTailCallee(wabt::Func_const&)::__0,wabt::(anonymous_namespace)::CWriter::WriteTailCallee(wabt::Func_const&)::__1>
          (CWriter *this,vector<wabt::Type,_std::allocator<wabt::Type>_> *vars,
          anon_class_1_0_00000001 *typeoffunc,anon_class_16_2_dcb8ff4f *todo,bool setjmp_safe)

{
  anon_class_1_0_00000001 *this_00;
  bool bVar1;
  Newline local_115;
  Type local_114;
  string_view local_108;
  string_view local_f8;
  string_view local_e8;
  string_view local_d8;
  Type local_c8;
  Type local_c0;
  Type local_b8;
  Type *local_b0;
  Type *var;
  const_iterator __end0;
  const_iterator __begin0;
  vector<wabt::Type,_std::allocator<wabt::Type>_> *__range3;
  size_t count;
  Type TStack_80;
  Index var_index;
  Type type;
  const_iterator __end2;
  const_iterator __begin2;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  initializer_list<wabt::Type::Enum> local_48;
  initializer_list<wabt::Type::Enum> *local_38;
  initializer_list<wabt::Type::Enum> *__range2;
  anon_class_16_2_dcb8ff4f *paStack_28;
  bool setjmp_safe_local;
  anon_class_16_2_dcb8ff4f *todo_local;
  anon_class_1_0_00000001 *typeoffunc_local;
  vector<wabt::Type,_std::allocator<wabt::Type>_> *vars_local;
  CWriter *this_local;
  
  __begin2 = (const_iterator)0xfffffffeffffffff;
  local_60 = 0xfffffffcfffffffd;
  local_58 = 0xfffffff0fffffffb;
  local_50 = 0xffffffe9ffffffef;
  local_48._M_array = (iterator)&__begin2;
  local_48._M_len = 8;
  local_38 = &local_48;
  __range2._7_1_ = setjmp_safe;
  paStack_28 = todo;
  todo_local = (anon_class_16_2_dcb8ff4f *)typeoffunc;
  typeoffunc_local = (anon_class_1_0_00000001 *)vars;
  vars_local = (vector<wabt::Type,_std::allocator<wabt::Type>_> *)this;
  __end2 = std::initializer_list<wabt::Type::Enum>::begin(local_38);
  type = (Type)std::initializer_list<wabt::Type::Enum>::end(local_38);
  for (; (Type)__end2 != type; __end2 = __end2 + 1) {
    Type::Type(&stack0xffffffffffffff80,*__end2);
    this_00 = typeoffunc_local;
    count._4_4_ = 0;
    __range3 = (vector<wabt::Type,_std::allocator<wabt::Type>_> *)0x0;
    __end0 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::begin
                       ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)typeoffunc_local);
    var = (Type *)std::vector<wabt::Type,_std::allocator<wabt::Type>_>::end
                            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
                                       *)&var), bVar1) {
      local_b0 = __gnu_cxx::
                 __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
                 ::operator*(&__end0);
      local_c0 = *local_b0;
      local_b8 = WriteTailCallee(wabt::Func_const&)::$_0::operator()((__0 *)todo_local,local_c0);
      local_c8 = TStack_80;
      bVar1 = wabt::operator==(local_b8,TStack_80);
      if (bVar1) {
        if (__range3 == (vector<wabt::Type,_std::allocator<wabt::Type>_> *)0x0) {
          Write<wabt::Type&,char_const(&)[2]>(this,&stack0xffffffffffffff80,(char (*) [2])0x234f67);
          if ((__range2._7_1_ & 1) != 0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_d8,"exceptions");
            anon_unknown_0::CWriter::PushFuncSection((CWriter *)this,local_d8);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_e8,"volatile ");
            anon_unknown_0::CWriter::Write((CWriter *)this,local_e8);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f8,"");
            anon_unknown_0::CWriter::PushFuncSection((CWriter *)this,local_f8);
          }
          anon_unknown_0::CWriter::Indent((CWriter *)this,4);
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_108,", ");
          anon_unknown_0::CWriter::Write((CWriter *)this,local_108);
          if (((ulong)__range3 & 7) == 0) {
            anon_unknown_0::CWriter::Write((CWriter *)this);
          }
        }
        local_114 = *local_b0;
        anon_unknown_0::CWriter::WriteTailCallee::anon_class_16_2_dcb8ff4f::operator()
                  (paStack_28,count._4_4_,local_114);
        __range3 = (vector<wabt::Type,_std::allocator<wabt::Type>_> *)
                   ((long)&(__range3->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                           _M_impl.super__Vector_impl_data._M_start + 1);
      }
      count._4_4_ = count._4_4_ + 1;
      __gnu_cxx::
      __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>::
      operator++(&__end0);
    }
    if (__range3 != (vector<wabt::Type,_std::allocator<wabt::Type>_> *)0x0) {
      anon_unknown_0::CWriter::Dedent((CWriter *)this,4);
      Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                (this,(char (*) [2])0x238bef,&local_115);
    }
  }
  return;
}

Assistant:

void CWriter::WriteVarsByType(const Vars& vars,
                              const TypeOf& typeoffunc,
                              const ToDo& todo,
                              bool setjmp_safe) {
  for (Type type : {Type::I32, Type::I64, Type::F32, Type::F64, Type::V128,
                    Type::FuncRef, Type::ExternRef, Type::ExnRef}) {
    Index var_index = 0;
    size_t count = 0;
    for (const auto& var : vars) {
      if (typeoffunc(var) == type) {
        if (count == 0) {
          Write(type, " ");
          if (setjmp_safe) {
            PushFuncSection("exceptions");
            Write("volatile ");
            PushFuncSection();
          }
          Indent(4);
        } else {
          Write(", ");
          if ((count % 8) == 0)
            Write(Newline());
        }

        todo(var_index, var);
        ++count;
      }
      ++var_index;
    }
    if (count != 0) {
      Dedent(4);
      Write(";", Newline());
    }
  }
}